

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# analyser.cpp
# Opt level: O0

void __thiscall Analyser::analyse_C0_program(Analyser *this)

{
  bool bVar1;
  TokenType TVar2;
  Token *pTVar3;
  Error *pEVar4;
  allocator<char> local_1d1;
  string local_1d0;
  _Self local_1b0;
  allocator<char> local_1a1;
  key_type local_1a0;
  _Self local_180;
  undefined1 local_172;
  allocator<char> local_171;
  string local_170;
  undefined1 local_150 [8];
  optional<Token> next;
  optional<Token> local_100;
  undefined1 local_d8 [16];
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_c8;
  optional<Token> local_a8;
  undefined1 local_80 [16];
  undefined1 local_70 [8];
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> tokenValue;
  undefined1 local_40 [8];
  optional<Token> next_1;
  bool isConst;
  Analyser *this_local;
  
  do {
    next_1.super__Optional_base<Token,_false,_false>._M_payload.
    super__Optional_payload<Token,_true,_false,_false>.super__Optional_payload_base<Token>._39_1_ =
         0;
    nextToken((optional<Token> *)local_40,this);
    bVar1 = std::optional<Token>::has_value((optional<Token> *)local_40);
    if (bVar1) {
      pTVar3 = std::optional<Token>::value((optional<Token> *)local_40);
      TVar2 = Token::GetType(pTVar3);
      if (TVar2 != RESERVED_WORD) goto LAB_0012695e;
      std::optional<Token>::value((optional<Token> *)local_40);
      Token::GetValue((Token *)local_80);
      std::any_cast<std::__cxx11::string>
                ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_70,
                 (any *)local_80);
      std::any::~any((any *)local_80);
      bVar1 = std::operator==((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                              local_70,"const");
      if (bVar1) {
        next_1.super__Optional_base<Token,_false,_false>._M_payload.
        super__Optional_payload<Token,_true,_false,_false>.super__Optional_payload_base<Token>.
        _39_1_ = 1;
        nextToken(&local_a8,this);
        std::optional<Token>::operator=((optional<Token> *)local_40,&local_a8);
        std::optional<Token>::~optional(&local_a8);
        std::optional<Token>::value((optional<Token> *)local_40);
        Token::GetValue((Token *)local_d8);
        std::any_cast<std::__cxx11::string>
                  ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                   (local_d8 + 0x10),(any *)local_d8);
        std::__cxx11::string::operator=((string *)local_70,(string *)(local_d8 + 0x10));
        std::__cxx11::string::~string((string *)(local_d8 + 0x10));
        std::any::~any((any *)local_d8);
      }
      bVar1 = std::operator==((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                              local_70,"void");
      if (bVar1) {
        unreadToken(this);
        tokenValue.field_2._8_4_ = 2;
        goto LAB_00126d30;
      }
      bVar1 = std::operator==((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                              local_70,"int");
      if (!bVar1) goto LAB_00126ce9;
      nextToken(&local_100,this);
      std::optional<Token>::operator=((optional<Token> *)local_40,&local_100);
      std::optional<Token>::~optional(&local_100);
      bVar1 = std::optional<Token>::has_value((optional<Token> *)local_40);
      if (bVar1) {
        pTVar3 = std::optional<Token>::value((optional<Token> *)local_40);
        TVar2 = Token::GetType(pTVar3);
        if (TVar2 != IDENTIFIER) goto LAB_00126bb6;
        nextToken((optional<Token> *)
                  &next.super__Optional_base<Token,_false,_false>._M_payload.
                   super__Optional_payload<Token,_true,_false,_false>.
                   super__Optional_payload_base<Token>._M_engaged,this);
        std::optional<Token>::operator=
                  ((optional<Token> *)local_40,
                   (optional<Token> *)
                   &next.super__Optional_base<Token,_false,_false>._M_payload.
                    super__Optional_payload<Token,_true,_false,_false>.
                    super__Optional_payload_base<Token>._M_engaged);
        std::optional<Token>::~optional
                  ((optional<Token> *)
                   &next.super__Optional_base<Token,_false,_false>._M_payload.
                    super__Optional_payload<Token,_true,_false,_false>.
                    super__Optional_payload_base<Token>._M_engaged);
        bVar1 = std::optional<Token>::has_value((optional<Token> *)local_40);
        if (bVar1) {
          pTVar3 = std::optional<Token>::value((optional<Token> *)local_40);
          TVar2 = Token::GetType(pTVar3);
          if (TVar2 != ASSIGNMENT_SIGN) {
            pTVar3 = std::optional<Token>::value((optional<Token> *)local_40);
            TVar2 = Token::GetType(pTVar3);
            if (TVar2 != SEMICOLON) {
              unreadToken(this);
              unreadToken(this);
              unreadToken(this);
              tokenValue.field_2._8_4_ = 2;
              goto LAB_00126d30;
            }
          }
LAB_00126ce9:
          if ((next_1.super__Optional_base<Token,_false,_false>._M_payload.
               super__Optional_payload<Token,_true,_false,_false>.
               super__Optional_payload_base<Token>._39_1_ & 1) != 0) {
            unreadToken(this);
          }
          unreadToken(this);
          unreadToken(this);
          unreadToken(this);
          tokenValue.field_2._8_4_ = 0;
        }
        else {
          unreadToken(this);
          unreadToken(this);
          unreadToken(this);
          tokenValue.field_2._8_4_ = 2;
        }
      }
      else {
LAB_00126bb6:
        unreadToken(this);
        unreadToken(this);
        tokenValue.field_2._8_4_ = 2;
      }
LAB_00126d30:
      std::__cxx11::string::~string((string *)local_70);
    }
    else {
LAB_0012695e:
      unreadToken(this);
      tokenValue.field_2._8_4_ = 2;
    }
    std::optional<Token>::~optional((optional<Token> *)local_40);
    if ((tokenValue.field_2._8_4_ != 0) || (bVar1 = analyse_variable_declaration(this), !bVar1)) {
      do {
        bVar1 = analyse_function_definition(this);
      } while (bVar1);
      nextToken((optional<Token> *)local_150,this);
      bVar1 = std::optional<Token>::has_value((optional<Token> *)local_150);
      if (bVar1) {
        local_172 = 1;
        pEVar4 = (Error *)__cxa_allocate_exception(0x28);
        std::allocator<char>::allocator();
        std::__cxx11::string::string<std::allocator<char>>
                  ((string *)&local_170,"Redundant tail",&local_171);
        Error::Error(pEVar4,&local_170,(long)this->_currentLine);
        local_172 = 0;
        __cxa_throw(pEVar4,&Error::typeinfo,Error::~Error);
      }
      std::allocator<char>::allocator();
      std::__cxx11::string::string<std::allocator<char>>((string *)&local_1a0,"main",&local_1a1);
      local_180._M_node =
           (_Base_ptr)
           std::
           map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int>_>_>
           ::find(&this->_functions,&local_1a0);
      local_1b0._M_node =
           (_Base_ptr)
           std::
           map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int>_>_>
           ::end(&this->_functions);
      bVar1 = std::operator==(&local_180,&local_1b0);
      std::__cxx11::string::~string((string *)&local_1a0);
      std::allocator<char>::~allocator(&local_1a1);
      if (bVar1) {
        pEVar4 = (Error *)__cxa_allocate_exception(0x28);
        std::allocator<char>::allocator();
        std::__cxx11::string::string<std::allocator<char>>
                  ((string *)&local_1d0,"Must have main()",&local_1d1);
        Error::Error(pEVar4,&local_1d0);
        __cxa_throw(pEVar4,&Error::typeinfo,Error::~Error);
      }
      std::optional<Token>::~optional((optional<Token> *)local_150);
      return;
    }
  } while( true );
}

Assistant:

void Analyser::analyse_C0_program() {
	do {
		//Ԥ����ȷ���Ƿ�Ϊ������������
		bool isConst = false;
		auto next = nextToken();
		if (!next.has_value() || (next.value().GetType() != TokenType::RESERVED_WORD)) {
			unreadToken();
			break;
		}
		auto tokenValue = std::any_cast<std::string>(next.value().GetValue());
		if (tokenValue == "const") {
			isConst = true;
			next = nextToken();
			tokenValue = std::any_cast<std::string>(next.value().GetValue());
		}
		if (tokenValue == "void") {
			unreadToken();
			break;
		}
		if (tokenValue == "int") {
			next = nextToken();
			if (!next.has_value() || (next.value().GetType() != TokenType::IDENTIFIER)) {
				unreadToken();
				unreadToken();
				break;
			}
			next = nextToken();
			if (!next.has_value()) {
				unreadToken();
				unreadToken();
				unreadToken();
				break;
			}
			if ((next.value().GetType() != TokenType::ASSIGNMENT_SIGN) && (next.value().GetType() != TokenType::SEMICOLON)) {
				unreadToken();
				unreadToken();
				unreadToken();
				break;
			}
		}
		if (isConst) {
			unreadToken();
		}
		unreadToken();
		unreadToken();
		unreadToken();
	} while (analyse_variable_declaration());
	while (analyse_function_definition()) {}
	auto next = nextToken();
	if (next.has_value()) {
		throw Error("Redundant tail", _currentLine);
	}
	if (_functions.find("main") == _functions.end()) {
		throw Error("Must have main()");
	}
}